

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O2

void __thiscall
icu_63::FCDUTF16CollationIterator::FCDUTF16CollationIterator
          (FCDUTF16CollationIterator *this,FCDUTF16CollationIterator *other,UChar *newText)

{
  char cVar1;
  short sVar2;
  UChar *pUVar3;
  char16_t *pcVar4;
  int iVar5;
  UChar *pUVar6;
  
  UTF16CollationIterator::UTF16CollationIterator
            (&this->super_UTF16CollationIterator,&other->super_UTF16CollationIterator);
  (this->super_UTF16CollationIterator).super_CollationIterator.super_UObject._vptr_UObject =
       (_func_int **)&PTR__FCDUTF16CollationIterator_003cab00;
  this->rawStart = newText;
  this->segmentStart =
       (UChar *)(((long)other->segmentStart - (long)other->rawStart) + (long)newText);
  pUVar6 = (UChar *)(((long)other->segmentLimit - (long)other->rawStart) + (long)newText);
  if (other->segmentLimit == (UChar *)0x0) {
    pUVar6 = (UChar *)0x0;
  }
  this->segmentLimit = pUVar6;
  pUVar6 = (UChar *)(((long)other->rawLimit - (long)other->rawStart) + (long)newText);
  if (other->rawLimit == (UChar *)0x0) {
    pUVar6 = (UChar *)0x0;
  }
  this->rawLimit = pUVar6;
  this->nfcImpl = other->nfcImpl;
  UnicodeString::UnicodeString(&this->normalized,&other->normalized);
  cVar1 = other->checkDir;
  this->checkDir = cVar1;
  pUVar6 = (other->super_UTF16CollationIterator).start;
  if ((cVar1 == '\0') && (pUVar6 != other->segmentStart)) {
    pcVar4 = UnicodeString::getBuffer(&this->normalized);
    (this->super_UTF16CollationIterator).start = pcVar4;
    (this->super_UTF16CollationIterator).pos =
         (UChar *)(((long)(other->super_UTF16CollationIterator).pos -
                   (long)(other->super_UTF16CollationIterator).start) + (long)pcVar4);
    sVar2 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar5 = (this->normalized).fUnion.fFields.fLength;
    }
    else {
      iVar5 = (int)sVar2 >> 5;
    }
    pcVar4 = pcVar4 + iVar5;
  }
  else {
    pUVar3 = other->rawStart;
    (this->super_UTF16CollationIterator).start =
         (UChar *)(((long)pUVar6 - (long)pUVar3) + (long)newText);
    (this->super_UTF16CollationIterator).pos =
         (UChar *)(((long)(other->super_UTF16CollationIterator).pos - (long)pUVar3) + (long)newText)
    ;
    pUVar6 = (other->super_UTF16CollationIterator).limit;
    pcVar4 = (char16_t *)(((long)pUVar6 - (long)other->rawStart) + (long)newText);
    if (pUVar6 == (UChar *)0x0) {
      pcVar4 = (char16_t *)0x0;
    }
  }
  (this->super_UTF16CollationIterator).limit = pcVar4;
  return;
}

Assistant:

FCDUTF16CollationIterator::FCDUTF16CollationIterator(const FCDUTF16CollationIterator &other,
                                                     const UChar *newText)
        : UTF16CollationIterator(other),
          rawStart(newText),
          segmentStart(newText + (other.segmentStart - other.rawStart)),
          segmentLimit(other.segmentLimit == NULL ? NULL : newText + (other.segmentLimit - other.rawStart)),
          rawLimit(other.rawLimit == NULL ? NULL : newText + (other.rawLimit - other.rawStart)),
          nfcImpl(other.nfcImpl),
          normalized(other.normalized),
          checkDir(other.checkDir) {
    if(checkDir != 0 || other.start == other.segmentStart) {
        start = newText + (other.start - other.rawStart);
        pos = newText + (other.pos - other.rawStart);
        limit = other.limit == NULL ? NULL : newText + (other.limit - other.rawStart);
    } else {
        start = normalized.getBuffer();
        pos = start + (other.pos - other.start);
        limit = start + normalized.length();
    }
}